

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gamefield.c
# Opt level: O3

uint8_t * GetRawColor32Array(Gamefield *gamefield)

{
  uint8_t *puVar1;
  Pixel *pPVar2;
  int i;
  long lVar3;
  
  puVar1 = (uint8_t *)malloc((ulong)(gamefield->width * gamefield->height * 4));
  pPVar2 = gamefield->pixels;
  lVar3 = 0;
  do {
    *(Color32 *)(puVar1 + lVar3 * 4) = pPVar2->color;
    lVar3 = lVar3 + 1;
    pPVar2 = pPVar2 + 1;
  } while (lVar3 != 0x13c680);
  return puVar1;
}

Assistant:

uint8_t* GetRawColor32Array(Gamefield* gamefield) {
    uint8_t* pixelArray = malloc(gamefield->width * gamefield->height * 4);
    size_t pixelArrayIndex = 0;
    for (int i = 0; i < GAMEFIELD_SIZE; i++) {
        pixelArray[pixelArrayIndex++] = gamefield->pixels[i].color.r;
        pixelArray[pixelArrayIndex++] = gamefield->pixels[i].color.g;
        pixelArray[pixelArrayIndex++] = gamefield->pixels[i].color.b;
        pixelArray[pixelArrayIndex++] = gamefield->pixels[i].color.a;
    }
    return pixelArray;
}